

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

void cs_impl::hash_set_cs_ext::insert(hash_set *set,var *val)

{
  any *in_RDI;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *this;
  undefined1 local_20 [32];
  
  this = (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
          *)local_20;
  any::any((any *)this,in_RDI);
  cs::copy((EVP_PKEY_CTX *)(local_20 + 8),(EVP_PKEY_CTX *)this);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  ::insert(this,in_RDI);
  any::~any((any *)0x43d6bb);
  any::~any((any *)0x43d6c5);
  return;
}

Assistant:

void insert(hash_set &set, const var &val)
		{
			set.insert(copy(val));
		}